

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

void Cba_ObjSetName(Cba_Ntk_t *p,int i,int x)

{
  int Fill;
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
  }
  else {
    if (0 < (p->vObjName).nSize) {
      Vec_IntFillExtra(&p->vObjName,i + 1,x);
      if ((p->vObjName).nSize <= i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vObjName).pArray[(uint)i] == 0) {
        Vec_IntFillExtra(&p->vObjName,i + 1,Fill);
        if (i < (p->vObjName).nSize) {
          (p->vObjName).pArray[(uint)i] = x;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __assert_fail("Cba_ObjName(p, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xf9,"void Cba_ObjSetName(Cba_Ntk_t *, int, int)");
    }
    __assertion = "Cba_NtkHasObjNames(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_ObjName( Cba_Ntk_t * p, int i )             { assert(i>0); assert( Cba_NtkHasObjNames(p) );  return Vec_IntGetEntry(&p->vObjName, i);     }